

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void cteClear(sqlite3 *db,Cte *pCte)

{
  Cte *pCte_local;
  sqlite3 *db_local;
  
  sqlite3ExprListDelete(db,pCte->pCols);
  sqlite3SelectDelete(db,pCte->pSelect);
  sqlite3DbFree(db,pCte->zName);
  return;
}

Assistant:

static void cteClear(sqlite3 *db, Cte *pCte){
  assert( pCte!=0 );
  sqlite3ExprListDelete(db, pCte->pCols);
  sqlite3SelectDelete(db, pCte->pSelect);
  sqlite3DbFree(db, pCte->zName);
}